

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O1

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::factorizeAndRecompute
          (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this)

{
  SPxOut *pSVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  int32_t iVar17;
  undefined8 in_RAX;
  cpp_dec_float<100U,_int,_void> *pcVar18;
  Verbosity old_verbosity;
  undefined8 local_18;
  
  local_18 = in_RAX;
  if (0 < (this->
          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).updateCount) {
    (*(this->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x75])(this);
  }
  computeFrhs(this);
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::solve(&this->
           super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ,&this->theFvec->
            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ,this->theFrhs);
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[(ulong)(this->theType == LEAVE) + 0x7c])(this);
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::coSolve(&this->
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ,&this->theCoPvec->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ,this->theCoPrhs);
  computePvec(this);
  pcVar18 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
  uVar2 = (pcVar18->data)._M_elems[1];
  uVar3 = (pcVar18->data)._M_elems[2];
  uVar4 = (pcVar18->data)._M_elems[3];
  uVar5 = (pcVar18->data)._M_elems[4];
  uVar6 = (pcVar18->data)._M_elems[5];
  uVar7 = (pcVar18->data)._M_elems[6];
  uVar8 = (pcVar18->data)._M_elems[7];
  uVar9 = (pcVar18->data)._M_elems[8];
  uVar10 = (pcVar18->data)._M_elems[9];
  uVar11 = (pcVar18->data)._M_elems[10];
  uVar12 = (pcVar18->data)._M_elems[0xb];
  uVar13 = (pcVar18->data)._M_elems[0xc];
  uVar14 = (pcVar18->data)._M_elems[0xd];
  uVar15 = (pcVar18->data)._M_elems[0xe];
  uVar16 = (pcVar18->data)._M_elems[0xf];
  (this->m_nonbasicValue).m_backend.data._M_elems[0] = (pcVar18->data)._M_elems[0];
  (this->m_nonbasicValue).m_backend.data._M_elems[1] = uVar2;
  (this->m_nonbasicValue).m_backend.data._M_elems[2] = uVar3;
  (this->m_nonbasicValue).m_backend.data._M_elems[3] = uVar4;
  (this->m_nonbasicValue).m_backend.data._M_elems[4] = uVar5;
  (this->m_nonbasicValue).m_backend.data._M_elems[5] = uVar6;
  (this->m_nonbasicValue).m_backend.data._M_elems[6] = uVar7;
  (this->m_nonbasicValue).m_backend.data._M_elems[7] = uVar8;
  (this->m_nonbasicValue).m_backend.data._M_elems[8] = uVar9;
  (this->m_nonbasicValue).m_backend.data._M_elems[9] = uVar10;
  (this->m_nonbasicValue).m_backend.data._M_elems[10] = uVar11;
  (this->m_nonbasicValue).m_backend.data._M_elems[0xb] = uVar12;
  (this->m_nonbasicValue).m_backend.data._M_elems[0xc] = uVar13;
  (this->m_nonbasicValue).m_backend.data._M_elems[0xd] = uVar14;
  (this->m_nonbasicValue).m_backend.data._M_elems[0xe] = uVar15;
  (this->m_nonbasicValue).m_backend.data._M_elems[0xf] = uVar16;
  (this->m_nonbasicValue).m_backend.exp = pcVar18->exp;
  (this->m_nonbasicValue).m_backend.neg = pcVar18->neg;
  iVar17 = pcVar18->prec_elem;
  (this->m_nonbasicValue).m_backend.fpclass = pcVar18->fpclass;
  (this->m_nonbasicValue).m_backend.prec_elem = iVar17;
  this->m_nonbasicValueUpToDate = false;
  pSVar1 = this->spxout;
  if ((pSVar1 != (SPxOut *)0x0) && (3 < (int)pSVar1->m_verbosity)) {
    local_18 = CONCAT44(pSVar1->m_verbosity,4);
    (*pSVar1->_vptr_SPxOut[2])();
    std::__ostream_insert<char,std::char_traits<char>>
              (this->spxout->m_streams[this->spxout->m_verbosity],
               " --- checking feasibility and optimality\n",0x29);
    (*this->spxout->_vptr_SPxOut[2])(this->spxout,(long)&local_18 + 4);
  }
  if (this->theType == LEAVE) {
    computeFtest(this);
  }
  else {
    computeCoTest(this);
    computeTest(this);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::factorizeAndRecompute()
   {
      // refactorize to eliminate accumulated errors from LU updates
      if(this->lastUpdate() > 0)
         factorize();

      computeFrhs();
      SPxBasisBase<R>::solve(*theFvec, *theFrhs);
      type() == LEAVE ? computeLeaveCoPrhs() : computeEnterCoPrhs();

      SPxBasisBase<R>::coSolve(*theCoPvec, *theCoPrhs);
      computePvec();

      forceRecompNonbasicValue();

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " --- checking feasibility and optimality\n")

      if(type() == LEAVE)
         computeFtest();
      else
      {
         computeCoTest();
         computeTest();
      }
   }